

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

_Bool set_contains(TSCharacterRange *ranges,uint32_t len,int32_t lookahead)

{
  uint uVar1;
  TSCharacterRange *pTVar2;
  bool local_41;
  TSCharacterRange *range;
  TSCharacterRange *range_1;
  uint32_t mid_index;
  uint32_t half_size;
  uint32_t size;
  uint32_t index;
  int32_t lookahead_local;
  uint32_t len_local;
  TSCharacterRange *ranges_local;
  
  half_size = 0;
  mid_index = len;
  while( true ) {
    if (mid_index < 2) {
      local_41 = false;
      if (ranges[half_size].start <= lookahead) {
        local_41 = lookahead <= ranges[half_size].end;
      }
      return local_41;
    }
    uVar1 = half_size + (mid_index >> 1);
    pTVar2 = ranges + uVar1;
    if ((pTVar2->start <= lookahead) && (lookahead <= pTVar2->end)) break;
    if (pTVar2->end < lookahead) {
      half_size = uVar1;
    }
    mid_index = mid_index - (mid_index >> 1);
  }
  return true;
}

Assistant:

static inline bool set_contains(TSCharacterRange *ranges, uint32_t len, int32_t lookahead) {
  uint32_t index = 0;
  uint32_t size = len - index;
  while (size > 1) {
    uint32_t half_size = size / 2;
    uint32_t mid_index = index + half_size;
    TSCharacterRange *range = &ranges[mid_index];
    if (lookahead >= range->start && lookahead <= range->end) {
      return true;
    } else if (lookahead > range->end) {
      index = mid_index;
    }
    size -= half_size;
  }
  TSCharacterRange *range = &ranges[index];
  return (lookahead >= range->start && lookahead <= range->end);
}